

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O3

void Gia_ManPrintObjClasses(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint *__s;
  int *__s_00;
  int iVar11;
  uint uVar12;
  int iVar13;
  size_t __size;
  long lVar14;
  long lVar15;
  uint *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint *puVar20;
  int local_8c;
  void *local_88;
  
  pVVar5 = p->vObjClasses;
  if (pVVar5 == (Vec_Int_t *)0x0) {
    return;
  }
  uVar2 = pVVar5->nSize;
  if (0 < (int)uVar2) {
    uVar3 = *pVVar5->pArray;
    if ((-2 < (long)(int)uVar3) && (uVar12 = uVar3 + 1, uVar12 < uVar2)) {
      if (pVVar5->pArray[uVar12] != uVar2) {
        __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x17a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      __size = (ulong)uVar12 << 2;
      __s = (uint *)malloc(__size);
      __s_00 = (int *)malloc(__size);
      iVar11 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
      uVar2 = p->nObjs;
      iVar13 = uVar2 * iVar11;
      iVar8 = 0x10;
      if (0xe < iVar13 - 1U) {
        iVar8 = iVar13;
      }
      if ((iVar8 == 0) || (local_88 = malloc((long)iVar8 << 2), local_88 == (void *)0x0)) {
        local_88 = (void *)0x0;
      }
      else {
        memset(local_88,0,(long)iVar13 << 2);
      }
      iVar8 = 0x1f;
      if (uVar2 - 1 != 0) {
        for (; uVar2 - 1 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      uVar12 = iVar8 + 0x21;
      if (uVar2 < 2) {
        uVar12 = uVar2;
      }
      local_8c = -1;
      uVar9 = ~(-1 << ((byte)uVar12 & 0x1f));
      if ((int)uVar9 < (int)uVar2) {
        __assert_fail("Gia_ManObjNum(p) <= nObjMask",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x183,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      puts("Frame   Core   F0   F1   F2   F3 ...");
      if (0 < (int)uVar3) {
        puVar20 = __s + -3;
        lVar15 = 1;
        uVar17 = 0;
        do {
          uVar1 = uVar17 + 1;
          if (((long)pVVar5->nSize <= (long)uVar1) || ((ulong)(uint)pVVar5->nSize <= uVar17 + 2))
          goto LAB_005fc8d9;
          piVar6 = pVVar5->pArray;
          uVar2 = piVar6[uVar1];
          uVar18 = (ulong)uVar2;
          local_8c = piVar6[uVar17 + 2];
          memset(__s,0,__size);
          memset(__s_00,0,__size);
          if ((int)uVar2 < local_8c) {
            puVar16 = (uint *)(piVar6 + uVar18);
            do {
              if (((int)uVar2 < 0) || (pVVar5->nSize <= (int)uVar18)) goto LAB_005fc8d9;
              uVar10 = (int)*puVar16 >> ((byte)uVar12 & 0x1f);
              uVar19 = (*puVar16 & uVar9) * iVar11;
              if (((int)uVar19 < 0) || (iVar13 <= (int)uVar19)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              uVar4 = *(uint *)((long)local_88 + (long)((int)uVar10 >> 5) * 4 + (ulong)uVar19 * 4);
              if ((uVar4 >> (uVar10 & 0x1f) & 1) == 0) {
                *(uint *)((long)local_88 + (long)((int)uVar10 >> 5) * 4 + (ulong)uVar19 * 4) =
                     uVar4 | 1 << ((byte)uVar10 & 0x1f);
                __s_00[(long)(int)uVar10 + 1] = __s_00[(long)(int)uVar10 + 1] + 1;
                *__s_00 = *__s_00 + 1;
              }
              __s[(long)(int)uVar10 + 1] = __s[(long)(int)uVar10 + 1] + 1;
              uVar10 = *__s + 1;
              *__s = uVar10;
              uVar19 = (int)uVar18 + 1;
              uVar18 = (ulong)uVar19;
              puVar16 = puVar16 + 1;
            } while ((int)uVar19 < local_8c);
          }
          else {
            uVar10 = *__s;
          }
          if (uVar10 != local_8c - uVar2) {
            __assert_fail("pCountAll[0] == (iStop - iStart)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                          ,0x19a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
          }
          printf("%3d :",uVar17 & 0xffffffff);
          printf("%7d",(ulong)uVar10);
          lVar14 = 0;
          if (uVar17 < 10) {
            do {
              printf("%5d",(ulong)__s[lVar14 + 1]);
              lVar14 = lVar14 + 1;
            } while (lVar15 != lVar14);
          }
          else {
            do {
              lVar7 = lVar14 + 1;
              lVar14 = lVar14 + 1;
              printf("%5d",(ulong)__s[lVar7]);
            } while (lVar14 != 4);
            printf("  ...");
            lVar14 = 0;
            do {
              printf("%5d",(ulong)puVar20[lVar14]);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 5);
          }
          putchar(10);
          lVar15 = lVar15 + 1;
          puVar20 = puVar20 + 1;
          uVar17 = uVar1;
        } while (uVar1 != (long)(int)uVar3);
      }
      if (local_8c != pVVar5->nSize) {
        __assert_fail("iStop == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x1b1,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      if (local_88 != (void *)0x0) {
        free(local_88);
      }
      if (__s != (uint *)0x0) {
        free(__s);
      }
      if (__s_00 == (int *)0x0) {
        return;
      }
      free(__s_00);
      return;
    }
  }
LAB_005fc8d9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManPrintObjClasses( Gia_Man_t * p )
{
    Vec_Int_t * vSeens;  // objects seen so far
    Vec_Int_t * vAbs = p->vObjClasses;
    int i, k, Entry, iStart, iStop = -1, nFrames;
    int nObjBits, nObjMask, iObj, iFrame, nWords;
    unsigned * pInfo;
    int * pCountAll, * pCountUni;
    if ( vAbs == NULL )
        return;
    nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    pCountAll = ABC_ALLOC( int, nFrames + 1 );
    pCountUni = ABC_ALLOC( int, nFrames + 1 );
    // start storage for seen objects
    nWords = Abc_BitWordNum( nFrames );
    vSeens = Vec_IntStart( Gia_ManObjNum(p) * nWords );
    // get the bitmasks
    nObjBits = Abc_Base2Log( Gia_ManObjNum(p) );
    nObjMask = (1 << nObjBits) - 1;
    assert( Gia_ManObjNum(p) <= nObjMask );
    // print info about frames
    printf( "Frame   Core   F0   F1   F2   F3 ...\n" );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        memset( pCountAll, 0, sizeof(int) * (nFrames + 1) );
        memset( pCountUni, 0, sizeof(int) * (nFrames + 1) );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
        {
            iObj   = (Entry &  nObjMask);
            iFrame = (Entry >> nObjBits);
            pInfo  = (unsigned *)Vec_IntEntryP( vSeens, nWords * iObj );
            if ( Abc_InfoHasBit(pInfo, iFrame) == 0 )
            {
                Abc_InfoSetBit( pInfo, iFrame );
                pCountUni[iFrame+1]++;
                pCountUni[0]++;
            }
            pCountAll[iFrame+1]++;
            pCountAll[0]++;
        }
        assert( pCountAll[0] == (iStop - iStart) );
//        printf( "%5d%5d  ", pCountAll[0], pCountUni[0] ); 
        printf( "%3d :", i );
        printf( "%7d", pCountAll[0] ); 
        if ( i >= 10 )
        {
            for ( k = 0; k < 4; k++ )
                printf( "%5d", pCountAll[k+1] ); 
            printf( "  ..." );
            for ( k = i-4; k <= i; k++ )
                printf( "%5d", pCountAll[k+1] ); 
        }
        else
        {
            for ( k = 0; k <= i; k++ )
                if ( k <= i )
                    printf( "%5d", pCountAll[k+1] ); 
        }
//        for ( k = 0; k < nFrames; k++ )
//            if ( k <= i )
//                printf( "%5d", pCountAll[k+1] ); 
        printf( "\n" );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    Vec_IntFree( vSeens );
    ABC_FREE( pCountAll );
    ABC_FREE( pCountUni );
}